

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

void __thiscall Highs::appendBasicRowsToBasisInterface(Highs *this,HighsInt ext_num_new_row)

{
  bool bVar1;
  pointer pHVar2;
  long lVar3;
  size_type __new_size;
  size_type __new_size_00;
  
  if ((ext_num_new_row != 0) && ((this->basis_).useful == true)) {
    bVar1 = (this->ekk_instance_).status_.has_basis;
    __new_size_00 = (long)ext_num_new_row + (long)(this->model_).lp_.num_row_;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&(this->basis_).row_status,__new_size_00);
    pHVar2 = (this->basis_).row_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar3 = (long)(this->model_).lp_.num_row_; lVar3 < (long)__new_size_00; lVar3 = lVar3 + 1)
    {
      pHVar2[lVar3] = kBasic;
    }
    if (bVar1 != false) {
      __new_size = (long)(int)__new_size_00 + (long)(this->model_).lp_.num_col_;
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                (&(this->ekk_instance_).basis_.nonbasicFlag_,__new_size);
      std::vector<signed_char,_std::allocator<signed_char>_>::resize
                (&(this->ekk_instance_).basis_.nonbasicMove_,__new_size);
      std::vector<int,_std::allocator<int>_>::resize
                (&(this->ekk_instance_).basis_.basicIndex_,__new_size_00);
      for (lVar3 = (long)(this->model_).lp_.num_row_; lVar3 < (long)__new_size_00; lVar3 = lVar3 + 1
          ) {
        (this->ekk_instance_).basis_.nonbasicFlag_.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3 + (this->model_).lp_.num_col_] = '\0';
        (this->ekk_instance_).basis_.nonbasicMove_.
        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar3 + (this->model_).lp_.num_col_] = '\0';
        (this->ekk_instance_).basis_.basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar3] = (this->model_).lp_.num_col_ + (int)lVar3;
      }
    }
  }
  return;
}

Assistant:

void Highs::appendBasicRowsToBasisInterface(const HighsInt ext_num_new_row) {
  if (ext_num_new_row == 0) return;
  HighsBasis& highs_basis = basis_;
  if (!highs_basis.useful) return;
  const bool has_simplex_basis = ekk_instance_.status_.has_basis;
  SimplexBasis& simplex_basis = ekk_instance_.basis_;
  HighsLp& lp = model_.lp_;

  assert(highs_basis.col_status.size() == static_cast<size_t>(lp.num_col_));
  assert(highs_basis.row_status.size() == static_cast<size_t>(lp.num_row_));

  // Add basic logicals
  // Add the new rows to the Highs basis
  HighsInt newNumRow = lp.num_row_ + ext_num_new_row;
  highs_basis.row_status.resize(newNumRow);
  for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++)
    highs_basis.row_status[iRow] = HighsBasisStatus::kBasic;
  if (has_simplex_basis) {
    // Add the new rows to the simplex basis
    HighsInt newNumTot = lp.num_col_ + newNumRow;
    simplex_basis.nonbasicFlag_.resize(newNumTot);
    simplex_basis.nonbasicMove_.resize(newNumTot);
    simplex_basis.basicIndex_.resize(newNumRow);
    for (HighsInt iRow = lp.num_row_; iRow < newNumRow; iRow++) {
      simplex_basis.nonbasicFlag_[lp.num_col_ + iRow] = kNonbasicFlagFalse;
      simplex_basis.nonbasicMove_[lp.num_col_ + iRow] = 0;
      simplex_basis.basicIndex_[iRow] = lp.num_col_ + iRow;
    }
  }
}